

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O3

DynamicType *
Js::PathTypeHandlerBase::CreateNewScopeObject<false>
          (ScriptContext *scriptContext,DynamicType *type,PropertyIdArray *propIds,
          PropertyAttributes extraAttributes,uint extraAttributesSlotCount)

{
  uint initialCapacity;
  int propertyId;
  code *pcVar1;
  byte attributes;
  bool bVar2;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *typeHandler;
  PropertyRecord *propertyRecord;
  undefined4 *puVar3;
  Recycler *pRVar4;
  DynamicType *this;
  ulong uVar5;
  undefined1 local_78 [8];
  TrackAllocData data;
  
  initialCapacity = propIds->count;
  pRVar4 = scriptContext->recycler;
  data._32_8_ = propIds;
  typeHandler = SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false>::
                New(pRVar4,initialCapacity,0,0,true,true);
  if ((ulong)initialCapacity != 0) {
    uVar5 = 0;
    do {
      propertyId = *(int *)(data._32_8_ + 8 + uVar5 * 4);
      if (propertyId == -1) {
        propertyRecord = (PropertyRecord *)0x0;
      }
      else {
        propertyRecord = ScriptContext::GetPropertyName(scriptContext,propertyId);
      }
      attributes = 5;
      if (uVar5 < extraAttributesSlotCount) {
        attributes = extraAttributes | 5;
      }
      SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>::
      Add<Js::PropertyRecord_const*>
                ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false> *)
                 typeHandler,propertyRecord,attributes,scriptContext);
      uVar5 = uVar5 + 1;
    } while (initialCapacity != uVar5);
  }
  if (((typeHandler->super_DynamicTypeHandler).flags & 0x20) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x7c1,"((typeHandler->GetFlags() & IsPrototypeFlag) == 0)",
                                "Why does a newly created type handler have the IsPrototypeFlag set?"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  scriptContext->objectLiteralSimpleDictionaryCount =
       scriptContext->objectLiteralSimpleDictionaryCount + 1;
  local_78 = (undefined1  [8])&DynamicType::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_9d226db;
  data.filename._0_4_ = 0x7c7;
  pRVar4 = Memory::Recycler::TrackAllocInfo(pRVar4,(TrackAllocData *)local_78);
  this = (DynamicType *)new<Memory::Recycler>(0x38,pRVar4,0x387914);
  DynamicType::DynamicType(this,type,&typeHandler->super_DynamicTypeHandler,true,true);
  return this;
}

Assistant:

DynamicType * PathTypeHandlerBase::CreateNewScopeObject(ScriptContext *scriptContext, DynamicType *type, const PropertyIdArray *propIds, PropertyAttributes extraAttributes, uint extraAttributesSlotCount)
    {
        uint count = propIds->count;

        Recycler* recycler = scriptContext->GetRecycler();

        SimpleDictionaryTypeHandler* typeHandler = SimpleDictionaryTypeHandler::New(recycler, count, 0, 0, true, true);

        for (uint i = 0; i < count; i++)
        {
            PropertyId propertyId = propIds->elements[i];
            const PropertyRecord* propertyRecord = propertyId == Constants::NoProperty ? NULL : scriptContext->GetPropertyName(propertyId);
            // This will add the property as initialized and non-fixed.  That's fine because we will populate the property values on the
            // scope object right after this (see JavascriptOperators::OP_InitCachedScope).  We will not treat these properties as fixed.
            PropertyAttributes attributes = PropertyWritable | PropertyEnumerable;
            if (i < extraAttributesSlotCount)
            {
                attributes |= extraAttributes;
                if (skipLetAttrForArguments && propertyId == PropertyIds::arguments)
                {
                    // Do not add let attribute for built-in arguments symbol
                    attributes &= ~PropertyLet;
                }
            }
            typeHandler->Add(propertyRecord, attributes, scriptContext);
        }
        AssertMsg((typeHandler->GetFlags() & IsPrototypeFlag) == 0, "Why does a newly created type handler have the IsPrototypeFlag set?");

 #ifdef PROFILE_OBJECT_LITERALS
        scriptContext->objectLiteralSimpleDictionaryCount++;
 #endif

        type = RecyclerNew(recycler, DynamicType, type, typeHandler, /* isLocked = */ true, /* isShared = */ true);

        return type;
    }